

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baling.h
# Opt level: O0

void __thiscall Baling::Baling(Baling *this)

{
  Point<double> local_f8;
  Point<double> local_e0;
  Point<double> local_c8;
  Point<double> local_b0;
  Point<double> local_98;
  Point<double> local_80;
  Point<double> local_68;
  Point<double> local_50;
  Point<double> local_28;
  Baling *local_10;
  Baling *this_local;
  
  local_10 = this;
  Polygon::Polygon(&this->super_Polygon);
  Point<double>::Point(&local_28,400.0,350.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_50,634.0,493.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_68,664.0,406.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_80,444.0,275.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_98,450.0,0.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_b0,350.0,0.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_c8,356.0,275.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_e0,115.0,406.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_f8,150.0,493.0,0.0);
  Polygon::addPoint((Point *)this);
  return;
}

Assistant:

Baling() {
    addPoint(Point<double>(400,350));
    addPoint(Point<double>(634,493));
    addPoint(Point<double>(664,406));
    addPoint(Point<double>(444,275));
    addPoint(Point<double>(450,0));
    addPoint(Point<double>(350,0));
    addPoint(Point<double>(356,275));
    addPoint(Point<double>(115,406));
    addPoint(Point<double>(150,493));
  }